

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void operational_stats_test(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *meta;
  fdb_iterator *in_stack_fffffffffffffac8;
  fdb_file_handle *in_stack_fffffffffffffad0;
  fdb_iterator *in_stack_fffffffffffffad8;
  size_t in_stack_fffffffffffffaf0;
  fdb_kvs_handle *local_4e8 [4];
  long local_4c8;
  fdb_doc **in_stack_fffffffffffffb40;
  fdb_iterator *in_stack_fffffffffffffb48;
  fdb_kvs_ops_info *in_stack_fffffffffffffb50;
  fdb_kvs_handle *in_stack_fffffffffffffb58;
  fdb_latency_stat stat;
  char local_488 [4];
  int i_1;
  char tmp [16];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_ops_info rinfo;
  fdb_kvs_ops_info info;
  fdb_iterator *iterator;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc real_doc;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kv;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  local_4e8[3] = (fdb_kvs_handle *)0x10d9f0;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_4e8[3] = (fdb_kvs_handle *)0x10d9fd;
  memleak_start();
  real_doc._72_8_ = &stack0xfffffffffffffac8;
  memset(&rinfo.num_iterator_moves,0,0x38);
  memset(&rdoc,0,0x50);
  real_doc.size_ondisk = (size_t)(bodybuf + 0xf8);
  real_doc.meta = &fconfig.num_blocks_readahead;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.wal_flush_before_commit = true;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  fdb_open((fdb_file_handle **)bodybuf._88_8_,(char *)bodybuf._80_8_,(fdb_config *)bodybuf._72_8_);
  if (multi_kv) {
    dbfile._0_4_ = 4;
    for (num_kv = 3; -1 < num_kv; num_kv = num_kv + -1) {
      sprintf(local_488,"kv%d",(ulong)(uint)num_kv);
      fVar1 = fdb_kvs_open((fdb_file_handle *)fconfig.log_msg_level,
                           (fdb_kvs_handle **)fconfig.breakpad_minidump_dir,
                           (char *)fconfig.num_keeping_headers,
                           (fdb_kvs_config *)fconfig.max_block_reusing_cycle);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x621);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x621,"void operational_stats_test(bool)");
        }
      }
      fVar1 = fdb_set_log_callback(local_4e8[num_kv],logCallbackFunc,"operational_stats_test");
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x624);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x624,"void operational_stats_test(bool)");
        }
      }
    }
  }
  else {
    dbfile._0_4_ = 1;
    fVar1 = fdb_kvs_open_default
                      (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->handle,
                       (fdb_kvs_config *)0x10dca4);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x629);
      operational_stats_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x629,"void operational_stats_test(bool)");
      }
    }
    fVar1 = fdb_set_log_callback(local_4e8[0],logCallbackFunc,"operational_stats_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x62c);
      operational_stats_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x62c,"void operational_stats_test(bool)");
      }
    }
  }
  for (n = 0; num_kv = (int)dbfile, n < 10; n = n + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    local_4c8 = real_doc._72_8_ + (long)n * 8;
    in_stack_fffffffffffffb40 = (fdb_doc **)(bodybuf + 0xf8);
    sVar3 = strlen(bodybuf + 0xf8);
    in_stack_fffffffffffffb48 = (fdb_iterator *)(sVar3 + 1);
    in_stack_fffffffffffffb50 = (fdb_kvs_ops_info *)&fconfig.num_blocks_readahead;
    meta = (void *)0x10de32;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (size_t)in_stack_fffffffffffffac8,meta,sVar3 + 1,(void *)0x10de67,
                   in_stack_fffffffffffffaf0);
    while (num_kv = num_kv + -1, -1 < num_kv) {
      fVar1 = fdb_set(local_4e8[num_kv],*(fdb_doc **)(real_doc._72_8_ + (long)n * 8));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x636);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x636,"void operational_stats_test(bool)");
        }
      }
      fVar1 = fdb_get_kvs_ops_info(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x638);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x638,"void operational_stats_test(bool)");
        }
      }
      rinfo.num_iterator_moves = (uint64_t)(n + 1);
      iVar2 = memcmp(keybuf + 0xf8,&rinfo.num_iterator_moves,0x38);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&rinfo.num_iterator_moves,
                keybuf + 0xf8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x63a);
        operational_stats_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x63a,"void operational_stats_test(bool)");
      }
    }
  }
  do {
    num_kv = num_kv + -1;
    if (num_kv < 0) {
      info.num_commits = info.num_commits + 1;
      fdb_compact(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      fVar1 = fdb_get_kvs_ops_info(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x663);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x663,"void operational_stats_test(bool)");
        }
      }
      iVar2 = memcmp(keybuf + 0xf8,&rinfo.num_iterator_moves,0x38);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&rinfo.num_iterator_moves,
                keybuf + 0xf8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x664);
        operational_stats_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x664,"void operational_stats_test(bool)");
      }
      n = 0;
      do {
        if (9 < n) {
          stat._20_4_ = 0;
          do {
            if (0x12 < (int)stat._20_4_) {
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffac8);
              for (n = 0; n < 10; n = n + 1) {
                fdb_doc_free((fdb_doc *)0x10e97e);
              }
              fdb_shutdown();
              memleak_end();
              pcVar4 = "single kv instance";
              if (multi_kv) {
                pcVar4 = "multiple kv instances";
              }
              sprintf((char *)&fconfig.num_blocks_readahead,"Operational stats test %s",pcVar4);
              if (operational_stats_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n",&fconfig.num_blocks_readahead);
              }
              else {
                fprintf(_stderr,"%s PASSED\n",&fconfig.num_blocks_readahead);
              }
              return;
            }
            memset(&stack0xfffffffffffffb58,0,0x18);
            fVar1 = fdb_get_latency_stats
                              ((fdb_file_handle *)db,(fdb_latency_stat *)&stack0xfffffffffffffb58,
                               stat._20_1_);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x67f);
              operational_stats_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x67f,"void operational_stats_test(bool)");
              }
            }
            fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",(ulong)(uint)stat._20_4_,
                    (ulong)stat.lat_count._4_4_,(ulong)stat.lat_min,(ulong)stat.lat_count._4_4_);
            stat._20_4_ = stat._20_4_ + 1;
          } while( true );
        }
        sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
        num_kv = (int)dbfile;
        while (num_kv = num_kv + -1, -1 < num_kv) {
          if (n % 2 == 0) {
            if (n % 4 == 0) {
              iterator._4_4_ = fdb_get_metaonly(local_4e8[num_kv],(fdb_doc *)&rdoc);
            }
            else {
              real_doc.key = (void *)(long)(n + 1);
              iterator._4_4_ = fdb_get_byseq(local_4e8[num_kv],(fdb_doc *)&rdoc);
            }
          }
          else {
            iterator._4_4_ = fdb_get(local_4e8[num_kv],(fdb_doc *)&rdoc);
          }
          if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x673);
            operational_stats_test::__test_pass = 0;
            if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x673,"void operational_stats_test(bool)");
            }
          }
          fVar1 = fdb_get_kvs_ops_info(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x675);
            operational_stats_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x675,"void operational_stats_test(bool)");
            }
          }
          info.num_compacts = (uint64_t)(n + 1);
          iVar2 = memcmp(keybuf + 0xf8,&rinfo.num_iterator_moves,0x38);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&rinfo.num_iterator_moves,
                    keybuf + 0xf8,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x677);
            operational_stats_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x677,"void operational_stats_test(bool)");
          }
        }
        n = n + 1;
      } while( true );
    }
    fdb_iterator_init(local_4e8[num_kv],(fdb_iterator **)&info.num_iterator_moves,(void *)0x0,0,
                      (void *)0x0,0,0);
    n = 0;
    do {
      fVar1 = fdb_iterator_get(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x644);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x644,"void operational_stats_test(bool)");
        }
      }
      iVar2 = memcmp((void *)real_doc.size_ondisk,
                     *(void **)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x20),(size_t)rdoc);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x20),
                real_doc.size_ondisk,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x645);
        operational_stats_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x645,"void operational_stats_test(bool)");
      }
      iVar2 = memcmp(real_doc.meta,*(void **)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x40),
                     real_doc.metalen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x40),real_doc.meta,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x646);
        operational_stats_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x646,"void operational_stats_test(bool)");
      }
      fVar1 = fdb_get_kvs_ops_info(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x648);
        operational_stats_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x648,"void operational_stats_test(bool)");
        }
      }
      info.num_gets = info.num_gets + 1;
      info.num_iterator_gets = info.num_iterator_gets + 1;
      iVar2 = memcmp(keybuf + 0xf8,&rinfo.num_iterator_moves,0x38);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&rinfo.num_iterator_moves,
                keybuf + 0xf8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x64b);
        operational_stats_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x64b,"void operational_stats_test(bool)");
      }
      n = n + 1;
      fVar1 = fdb_iterator_next(in_stack_fffffffffffffac8);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    info.num_iterator_gets = info.num_iterator_gets + 1;
    fdb_iterator_close(in_stack_fffffffffffffad8);
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffffac8,'\0');
    info.num_dels = info.num_dels + 1;
    fVar1 = fdb_get_kvs_ops_info(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x655);
      operational_stats_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x655,"void operational_stats_test(bool)");
      }
    }
    iVar2 = memcmp(keybuf + 0xf8,&rinfo.num_iterator_moves,0x38);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&rinfo.num_iterator_moves,
              keybuf + 0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x656);
      operational_stats_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x656,"void operational_stats_test(bool)");
    }
    if (num_kv != 0) {
      info.num_gets = 0;
      info.num_iterator_gets = 0;
    }
  } while( true );
}

Assistant:

void operational_stats_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_kvs_ops_info info, rinfo;

    char keybuf[256], bodybuf[256];
    memset(&info, 0, sizeof(fdb_kvs_ops_info));
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "operational_stats_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "operational_stats_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_sets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ++info.num_iterator_gets;
            ++info.num_iterator_moves;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
            ++i;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        ++info.num_iterator_moves; // account for the last move that failed
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        ++info.num_commits;

        status = fdb_get_kvs_ops_info(db[r], &rinfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

        if (r) {
            info.num_iterator_gets = 0;
            info.num_iterator_moves = 0;
        }
    }

    ++info.num_compacts;
    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    status = fdb_get_kvs_ops_info(db[0], &rinfo);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            if (i % 2 == 0) {
                if (i % 4 == 0) {
                    status = fdb_get_metaonly(db[r], rdoc);
                } else {
                    rdoc->seqnum = i + 1;
                    status = fdb_get_byseq(db[r], rdoc);
                }
            } else {
                status = fdb_get(db[r], rdoc);
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_gets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }
    // also get latency stats..
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        fdb_latency_stat stat;
        memset(&stat, 0, sizeof(fdb_latency_stat));
        status = fdb_get_latency_stats(dbfile, &stat, i);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fprintf(stderr, "%d:\t%u\t%u\t%u\t%" _F64 "\n", i,
                stat.lat_max, stat.lat_avg, stat.lat_max, stat.lat_count);
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Operational stats test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}